

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodePostIdxReg(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t uVar2;
  DecodeStatus In;
  uint add;
  uint Rm;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  add = 3;
  _Rm = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Insn,0,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,4,1);
  In = DecodeGPRnopcRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rm);
  _Var1 = Check(&add,In);
  if (_Var1) {
    MCOperand_CreateImm0(pMStack_18,(ulong)uVar2);
    Inst_local._4_4_ = add;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodePostIdxReg(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned add = fieldFromInstruction_4(Insn, 4, 1);

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, add);

	return S;
}